

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O2

quad_value_bit_vector *
bsim::orr(quad_value_bit_vector *__return_storage_ptr__,quad_value_bit_vector *a)

{
  bool bVar1;
  long lVar2;
  quad_value local_49;
  string local_48;
  
  lVar2 = 0;
  do {
    if (a->N <= lVar2) {
      std::__cxx11::string::string((string *)&local_48,"0",(allocator *)&local_49);
      quad_value_bit_vector::quad_value_bit_vector(__return_storage_ptr__,1,&local_48);
      goto LAB_0017f941;
    }
    local_48._M_dataplus._M_p._0_1_ =
         (a->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
         super__Vector_impl_data._M_start[lVar2].value;
    local_49.value = '\x01';
    bVar1 = operator==((quad_value *)&local_48,&local_49);
    lVar2 = lVar2 + 1;
  } while (!bVar1);
  std::__cxx11::string::string((string *)&local_48,"1",(allocator *)&local_49);
  quad_value_bit_vector::quad_value_bit_vector(__return_storage_ptr__,1,&local_48);
LAB_0017f941:
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

static inline quad_value_bit_vector
  orr(const quad_value_bit_vector& a) {
    for (int i = 0; i < a.bitLength(); i++) {
      if (a.get(i) == 1) {
	return quad_value_bit_vector(1, "1");
      }
    }

    return quad_value_bit_vector(1, "0");
  }